

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<Fad<double>_>::SolveEigensystemJacobi
          (TPZMatrix<Fad<double>_> *this,int64_t *numiterations,REAL *tol,
          TPZVec<Fad<double>_> *Eigenvalues,TPZFMatrix<Fad<double>_> *Eigenvectors)

{
  bool bVar1;
  TPZVec<Fad<double>_> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  long *in_R8;
  double dVar2;
  Fad<double> val;
  int64_t i_9;
  Fad<double> exp_1;
  int64_t i_8;
  int64_t i_7;
  REAL norm2;
  int64_t i_6;
  double difTemp;
  double dif;
  int64_t count;
  int64_t i_5;
  int64_t i_4;
  REAL norm1;
  int64_t i_3;
  int64_t i_2;
  Fad<double> exp;
  Fad<double> answ;
  TPZFNMatrix<9,_Fad<double>_> Matrix_1;
  int64_t i_1;
  int64_t eigen;
  TPZFNMatrix<3,_Fad<double>_> VecIni_cp;
  TPZFNMatrix<3,_Fad<double>_> VecIni;
  bool result;
  int64_t j;
  int64_t i;
  TPZFNMatrix<9,_Fad<double>_> Matrix;
  int64_t size;
  REAL tolerance;
  int64_t NumIt;
  Fad<double> *in_stack_fffffffffffff448;
  Fad<double> *in_stack_fffffffffffff450;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff458;
  Fad<double> *in_stack_fffffffffffff460;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *in_stack_fffffffffffff468;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff470;
  Fad<double> *in_stack_fffffffffffff480;
  Fad<double> *in_stack_fffffffffffff488;
  Fad<double> *in_stack_fffffffffffff498;
  Fad<double> *in_stack_fffffffffffff4a0;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff4a8;
  TPZFNMatrix<9,_Fad<double>_> *in_stack_fffffffffffff4b0;
  Fad<double> *in_stack_fffffffffffff4c8;
  undefined7 in_stack_fffffffffffff4d0;
  undefined1 in_stack_fffffffffffff4d7;
  int64_t in_stack_fffffffffffff4d8;
  TPZFNMatrix<3,_Fad<double>_> *in_stack_fffffffffffff4e0;
  TPZMatrix<Fad<double>_> *in_stack_fffffffffffff4f8;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffff500;
  long local_a48;
  Fad<double> *in_stack_fffffffffffff5f8;
  TPZVec<Fad<double>_> *in_stack_fffffffffffff600;
  Fad<double> *in_stack_fffffffffffff608;
  long local_9c0;
  long local_9b8;
  double local_9b0;
  long local_9a8;
  double local_9a0;
  double local_998;
  long local_990;
  long local_958;
  long local_950;
  double local_948;
  undefined1 local_908 [80];
  long local_8b8;
  double local_8b0;
  undefined1 local_858 [80];
  long local_808;
  undefined8 local_7d0;
  int local_504;
  long local_4e0;
  long local_4d8;
  undefined8 local_4d0;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffbe0;
  REAL *in_stack_fffffffffffffbe8;
  int64_t *in_stack_fffffffffffffbf0;
  TPZMatrix<Fad<double>_> *in_stack_fffffffffffffbf8;
  undefined1 local_248 [32];
  long local_228;
  long local_220;
  int64_t local_48;
  double local_40;
  long local_38;
  long *local_30;
  TPZVec<Fad<double>_> *local_28;
  byte local_1;
  
  local_38 = *in_RSI;
  local_40 = *in_RDX;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_48 = TPZBaseMatrix::Rows(in_RDI);
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffff4b0,(int64_t)in_stack_fffffffffffff4a8,
             (int64_t)in_stack_fffffffffffff4a0);
  for (local_220 = 0; local_220 < local_48; local_220 = local_220 + 1) {
    for (local_228 = 0; local_228 < local_48; local_228 = local_228 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(local_248,in_RDI,local_220,local_228);
      TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                 (int64_t)in_stack_fffffffffffff460);
      Fad<double>::operator=(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
      Fad<double>::~Fad(in_stack_fffffffffffff450);
    }
  }
  bVar1 = SolveEigenvaluesJacobi
                    (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                     in_stack_fffffffffffffbe0);
  if (bVar1) {
    Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458)
    ;
    TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
              (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
               in_stack_fffffffffffff4c8);
    Fad<double>::~Fad(in_stack_fffffffffffff450);
    local_4d0 = 0;
    Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458)
    ;
    TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
              (in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
               CONCAT17(in_stack_fffffffffffff4d7,in_stack_fffffffffffff4d0),
               in_stack_fffffffffffff4c8);
    Fad<double>::~Fad(in_stack_fffffffffffff450);
    (**(code **)(*local_30 + 0x68))(local_30,local_48);
    (**(code **)(*local_30 + 0x78))();
    for (local_4d8 = 0; local_4d8 < local_48; local_4d8 = local_4d8 + 1) {
      for (local_4e0 = 0; local_4e0 < local_48; local_4e0 = local_4e0 + 1) {
        local_504 = rand();
        Fad<double>::Fad<int,_nullptr>(in_stack_fffffffffffff460,(int *)in_stack_fffffffffffff458);
        TPZFMatrix<Fad<double>_>::PutVal
                  (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                   (int64_t)in_stack_fffffffffffff460,(Fad<double> *)in_stack_fffffffffffff458);
        Fad<double>::~Fad(in_stack_fffffffffffff450);
      }
      TPZFMatrix<Fad<double>_>::TPZFMatrix(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8)
      ;
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x1337190);
      TPZVec<Fad<double>_>::operator[](local_28,local_4d8);
      Fad<double>::Fad(in_stack_fffffffffffff460,(Fad<double> *)in_stack_fffffffffffff458);
      local_7d0 = 0x3ee4f8b588e368f1;
      Fad<double>::Fad<double,_nullptr>
                (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458);
      ReturnNearestValue(in_stack_fffffffffffff608,in_stack_fffffffffffff600,
                         in_stack_fffffffffffff5f8);
      Fad<double>::~Fad(in_stack_fffffffffffff450);
      Fad<double>::~Fad(in_stack_fffffffffffff450);
      TPZVec<Fad<double>_>::operator[](local_28,local_4d8);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
      Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                (in_stack_fffffffffffff4a0,
                 (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff498);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff450);
      dVar2 = fabs<double>((Fad<double> *)0x13372af);
      if (dVar2 <= 1e-05) {
        for (local_8b8 = 0; local_8b8 < local_48; local_8b8 = local_8b8 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_908,in_RDI,local_8b8);
          TPZVec<Fad<double>_>::operator[](local_28,local_4d8);
          Fad<double>::Fad<double,_nullptr>
                    (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458);
          operator-<Fad<double>,_Fad<double>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          operator-<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                    (in_stack_fffffffffffff488,
                     (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffff480);
          Fad<double>::
          Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>>>
                    (in_stack_fffffffffffff4a0,
                     (FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                      *)in_stack_fffffffffffff498);
          TPZFMatrix<Fad<double>_>::PutVal
                    (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                     (int64_t)in_stack_fffffffffffff460,(Fad<double> *)in_stack_fffffffffffff458);
          Fad<double>::~Fad(in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
          ::~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                      *)in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffff450);
          Fad<double>::~Fad(in_stack_fffffffffffff450);
          Fad<double>::~Fad(in_stack_fffffffffffff450);
        }
      }
      else {
        for (local_808 = 0; local_808 < local_48; local_808 = local_808 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_858,in_RDI,local_808);
          TPZVec<Fad<double>_>::operator[](local_28,local_4d8);
          local_8b0 = fabs<double>((Fad<double> *)0x133735f);
          local_8b0 = local_8b0 * 0.01;
          Fad<double>::Fad<double,_nullptr>
                    (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458);
          operator-<Fad<double>,_Fad<double>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                    (in_stack_fffffffffffff4a0,
                     (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffff498);
          operator-<Fad<double>,_Fad<double>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                    (in_stack_fffffffffffff4a0,
                     (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffff498);
          TPZFMatrix<Fad<double>_>::PutVal
                    (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                     (int64_t)in_stack_fffffffffffff460,(Fad<double> *)in_stack_fffffffffffff458);
          Fad<double>::~Fad(in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffff450);
          Fad<double>::~Fad(in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffff450);
          Fad<double>::~Fad(in_stack_fffffffffffff450);
          Fad<double>::~Fad(in_stack_fffffffffffff450);
        }
      }
      local_948 = 0.0;
      for (local_950 = 0; local_950 < local_48; local_950 = local_950 + 1) {
        in_stack_fffffffffffff500 =
             (TPZFMatrix<Fad<double>_> *)
             TPZFMatrix<Fad<double>_>::operator()
                       (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                        (int64_t)in_stack_fffffffffffff460);
        in_stack_fffffffffffff4f8 =
             (TPZMatrix<Fad<double>_> *)fabs<double>((Fad<double> *)0x13378ea);
        TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                   (int64_t)in_stack_fffffffffffff460);
        dVar2 = fabs<double>((Fad<double> *)0x1337925);
        local_948 = (double)in_stack_fffffffffffff4f8 * dVar2 + local_948;
      }
      sqrt(local_948);
      for (local_958 = 0; local_958 < local_48; local_958 = local_958 + 1) {
        TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                   (int64_t)in_stack_fffffffffffff460);
        Fad<double>::Fad<double,_nullptr>
                  (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458);
        operator/<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
        TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                   (int64_t)in_stack_fffffffffffff460);
        Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
        FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff450);
        Fad<double>::~Fad(in_stack_fffffffffffff450);
      }
      local_998 = 10.0;
      for (local_990 = 0; local_40 < local_998 && local_990 <= local_38; local_990 = local_990 + 1)
      {
        for (local_9a8 = 0; local_9a8 < local_48; local_9a8 = local_9a8 + 1) {
          TPZFMatrix<Fad<double>_>::operator()
                    (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                     (int64_t)in_stack_fffffffffffff460);
          TPZFMatrix<Fad<double>_>::operator()
                    (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                     (int64_t)in_stack_fffffffffffff460);
          Fad<double>::operator=(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
        }
        Solve_LU((TPZMatrix<Fad<double>_> *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
        local_9b0 = 0.0;
        for (local_9b8 = 0; local_9b8 < local_48; local_9b8 = local_9b8 + 1) {
          TPZFMatrix<Fad<double>_>::operator()
                    (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                     (int64_t)in_stack_fffffffffffff460);
          in_stack_fffffffffffff4b0 =
               (TPZFNMatrix<9,_Fad<double>_> *)fabs<double>((Fad<double> *)0x1337c2c);
          in_stack_fffffffffffff4a8 =
               (TPZFMatrix<Fad<double>_> *)
               TPZFMatrix<Fad<double>_>::operator()
                         (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                          (int64_t)in_stack_fffffffffffff460);
          in_stack_fffffffffffff4a0 = (Fad<double> *)fabs<double>((Fad<double> *)0x1337c5e);
          local_9b0 = (double)in_stack_fffffffffffff4b0 * (double)in_stack_fffffffffffff4a0 +
                      local_9b0;
        }
        sqrt(local_9b0);
        local_9a0 = 0.0;
        for (local_9c0 = 0; local_9c0 < local_48; local_9c0 = local_9c0 + 1) {
          in_stack_fffffffffffff498 =
               TPZFMatrix<Fad<double>_>::operator()
                         (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                          (int64_t)in_stack_fffffffffffff460);
          Fad<double>::Fad<double,_nullptr>
                    (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458);
          operator/<Fad<double>,_Fad<double>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          TPZFMatrix<Fad<double>_>::operator()
                    (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                     (int64_t)in_stack_fffffffffffff460);
          Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468)
          ;
          FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff450)
          ;
          Fad<double>::~Fad(in_stack_fffffffffffff450);
          in_stack_fffffffffffff488 =
               TPZFMatrix<Fad<double>_>::operator()
                         (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                          (int64_t)in_stack_fffffffffffff460);
          in_stack_fffffffffffff480 =
               TPZFMatrix<Fad<double>_>::operator()
                         (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                          (int64_t)in_stack_fffffffffffff460);
          operator-<Fad<double>,_Fad<double>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          TPZFMatrix<Fad<double>_>::operator()
                    (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                     (int64_t)in_stack_fffffffffffff460);
          in_stack_fffffffffffff470 =
               (TPZFMatrix<Fad<double>_> *)
               TPZFMatrix<Fad<double>_>::operator()
                         (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                          (int64_t)in_stack_fffffffffffff460);
          operator-<Fad<double>,_Fad<double>,_nullptr>
                    (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
          operator*<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_nullptr>
                    ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffff488,
                     (FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffff480);
          Fad<double>::
          Fad<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>>>
                    (in_stack_fffffffffffff4a0,
                     (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                      *)in_stack_fffffffffffff498);
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
          ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
                      *)in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffff450);
          FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffff450);
          in_stack_fffffffffffff468 =
               (FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)
               fabs<double>((Fad<double> *)0x1337ea7);
          local_9a0 = (double)in_stack_fffffffffffff468 + local_9a0;
          Fad<double>::~Fad(in_stack_fffffffffffff450);
        }
        local_998 = sqrt(local_9a0);
      }
      for (local_a48 = 0; local_a48 < local_48; local_a48 = local_a48 + 1) {
        in_stack_fffffffffffff460 =
             TPZFMatrix<Fad<double>_>::operator()
                       (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                        (int64_t)in_stack_fffffffffffff460);
        Fad<double>::Fad(in_stack_fffffffffffff460,(Fad<double> *)in_stack_fffffffffffff458);
        in_stack_fffffffffffff458 =
             (TPZFMatrix<Fad<double>_> *)fabs<double>((Fad<double> *)0x133805b);
        if ((double)in_stack_fffffffffffff458 < 1e-05) {
          Fad<double>::operator=<double,_nullptr>
                    (in_stack_fffffffffffff460,(double *)in_stack_fffffffffffff458);
        }
        in_stack_fffffffffffff450 =
             TPZFMatrix<Fad<double>_>::operator()
                       (in_stack_fffffffffffff470,(int64_t)in_stack_fffffffffffff468,
                        (int64_t)in_stack_fffffffffffff460);
        Fad<double>::operator=(in_stack_fffffffffffff450,in_stack_fffffffffffff448);
        Fad<double>::~Fad(in_stack_fffffffffffff450);
      }
      Fad<double>::~Fad(in_stack_fffffffffffff450);
      Fad<double>::~Fad(in_stack_fffffffffffff450);
      TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x1338147);
    }
    local_1 = 1;
    TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<3,_Fad<double>_> *)0x13381a9);
    TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<3,_Fad<double>_> *)0x13381b6);
  }
  else {
    local_1 = 0;
  }
  TPZFNMatrix<9,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<9,_Fad<double>_> *)0x13381e1);
  return (bool)(local_1 & 1);
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}